

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O3

time_t curl_getdate(char *p,time_t *now)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  int *piVar10;
  time_t tVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  ulong uVar16;
  int iVar17;
  char **what;
  char **ppcVar18;
  long lVar19;
  int i;
  bool bVar20;
  int len;
  int minnum;
  int hournum;
  char buf [32];
  uint local_88;
  int local_84;
  ulong local_80;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  byte *local_60;
  byte *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar14 = 0xffffffff;
  local_6c = -1;
  local_70 = -1;
  local_84 = -1;
  uVar8 = (uint)(byte)*p;
  local_88 = 0xffffffff;
  iVar7 = -1;
  iVar17 = -1;
  if (*p != 0) {
    lVar12 = 0xffffffff;
    local_88 = 0xffffffff;
    uVar16 = 0;
    local_80 = 0xffffffff;
    bVar5 = false;
    local_60 = (byte *)p;
LAB_0046603e:
    do {
      iVar7 = Curl_isalnum(uVar8);
      if (iVar7 == 0) {
        pbVar1 = (byte *)p + 1;
        uVar8 = (uint)*pbVar1;
        p = (char *)((byte *)p + 1);
        if (*pbVar1 != 0) goto LAB_0046603e;
        uVar8 = 0;
      }
      else {
        uVar8 = (uint)(byte)*p;
      }
      iVar7 = Curl_isalpha(uVar8);
      if (iVar7 == 0) {
        iVar7 = Curl_isdigit((uint)(byte)*p);
        if (iVar7 != 0) {
          local_74 = 0;
          if (local_84 == -1) {
            iVar7 = __isoc99_sscanf(p,"%02d:%02d:%02d%n",&local_6c,&local_70,&local_84,&local_74);
            if (iVar7 != 3) {
              if ((local_84 != -1) ||
                 (iVar7 = __isoc99_sscanf(p,"%02d:%02d%n",&local_6c,&local_70,&local_74), iVar7 != 2
                 )) goto LAB_004660ca;
              local_84 = 0;
            }
            p = (char *)((byte *)p + local_74);
          }
          else {
LAB_004660ca:
            local_68 = uVar16;
            piVar10 = __errno_location();
            iVar7 = *piVar10;
            *piVar10 = 0;
            lVar19 = strtol(p,(char **)&local_58,10);
            uVar16 = local_68;
            iVar3 = *piVar10;
            if (iVar3 != iVar7) {
              *piVar10 = iVar7;
            }
            if ((iVar3 != 0) || (lVar19 - 0x80000000U < 0xffffffff00000000)) goto LAB_004664e5;
            uVar8 = curlx_sltosi(lVar19);
            lVar19 = (long)local_58 - (long)p;
            if (iVar17 == -1) {
              iVar17 = -1;
              bVar4 = false;
              if (((local_60 < p) && (bVar4 = false, lVar19 == 4)) &&
                 (bVar4 = false, (int)uVar8 < 0x579)) {
                bVar2 = ((byte *)p)[-1];
                lVar19 = 4;
                if ((bVar2 != 0x2d) && (bVar2 != 0x2b)) goto LAB_00466146;
                iVar7 = uVar8 + ((int)uVar8 / 100) * -0x28;
                iVar17 = iVar7 * -0x3c;
                if (bVar2 != 0x2b) {
                  iVar17 = iVar7 * 0x3c;
                }
                bVar4 = true;
              }
            }
            else {
LAB_00466146:
              bVar4 = false;
            }
            if (((lVar19 == 8) && ((int)local_80 == -1)) &&
               ((uVar14 == 0xffffffff && (local_88 == 0xffffffff)))) {
              local_80 = (ulong)(uint)((int)uVar8 / 10000);
              uVar14 = (uint)(short)((short)((short)uVar8 + (short)((int)uVar8 / 10000) * -10000) /
                                     100 + -1);
              local_88 = (int)uVar8 % 100;
              bVar4 = true;
            }
            bVar15 = (bool)(local_88 == 0xffffffff & !bVar5 & ~bVar4);
            bVar20 = uVar8 - 1 < 0x1f;
            uVar13 = 0xffffffff;
            if (bVar20) {
              uVar13 = uVar8;
            }
            bVar20 = (bool)(bVar20 & bVar15);
            bVar6 = true;
            if (!bVar15) {
              uVar13 = local_88;
              bVar6 = bVar5;
            }
            p = (char *)local_58;
            local_88 = uVar13;
            if (((bVar20 || bVar4) || (!bVar6)) || ((int)local_80 != -1)) {
              bVar5 = bVar6;
              if (!bVar20 && !bVar4) goto LAB_004664e5;
            }
            else {
              if ((int)uVar8 < 100) {
                if ((int)uVar8 < 0x47) {
                  uVar8 = uVar8 + 2000;
                }
                else {
                  uVar8 = uVar8 + 0x76c;
                }
              }
              local_80 = (ulong)uVar8;
              bVar5 = uVar13 != 0xffffffff;
            }
          }
        }
      }
      else {
        local_48 = 0;
        uStack_40 = 0;
        local_58 = (byte *)0x0;
        uStack_50 = 0;
        local_68 = uVar16;
        iVar7 = __isoc99_sscanf(p,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                                &local_58);
        if (iVar7 == 0) {
          sVar9 = 0;
        }
        else {
          sVar9 = strlen((char *)&local_58);
        }
        if ((int)lVar12 == -1) {
          ppcVar18 = Curl_wkday;
          if (3 < sVar9) {
            ppcVar18 = weekday;
          }
          lVar12 = 0;
          do {
            iVar7 = Curl_strcasecompare((char *)&local_58,ppcVar18[lVar12]);
            if (iVar7 != 0) goto LAB_0046631c;
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 7);
          lVar12 = 0xffffffff;
        }
        if (uVar14 == 0xffffffff) {
          uVar14 = 0;
          ppcVar18 = Curl_month;
          do {
            iVar7 = Curl_strcasecompare((char *)&local_58,*ppcVar18);
            if (iVar7 != 0) goto LAB_0046631c;
            ppcVar18 = ppcVar18 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0xc);
          uVar14 = 0xffffffff;
        }
        if (iVar17 != -1) goto LAB_004664e5;
        lVar19 = 0;
        while (iVar7 = Curl_strcasecompare((char *)&local_58,tz[0].name + lVar19), iVar7 == 0) {
          lVar19 = lVar19 + 0xc;
          if ((int)lVar19 == 0x33c) goto LAB_004664e5;
        }
        iVar17 = *(int *)(tz[0].name + lVar19 + 8) * 0x3c;
LAB_0046631c:
        p = (char *)((byte *)p + sVar9);
        uVar16 = local_68;
      }
      uVar8 = (uint)(byte)*p;
      if ((*p == 0) || (uVar13 = (uint)uVar16, uVar16 = (ulong)(uVar13 + 1), 4 < uVar13))
      goto LAB_00466480;
    } while( true );
  }
LAB_00466493:
  local_84 = 0;
  local_6c = 0;
  local_70 = 0;
LAB_0046649d:
  if (((local_88 == 0xffffffff) || (uVar14 == 0xffffffff)) ||
     ((iVar7 < 0x62f ||
      ((((0x3c < local_84 || (0x1f < (int)local_88)) || (0xb < (int)uVar14)) ||
       ((0x17 < local_6c || (0x3b < local_70)))))))) {
LAB_004664e5:
    tVar11 = -1;
  }
  else {
    uVar8 = uVar14;
    if ((int)uVar14 < 0) {
      uVar8 = (0xb - uVar14) / 0xc;
      iVar7 = iVar7 + uVar8;
      uVar8 = (uVar8 * 0xc - (0xb - uVar14)) + 0xb;
    }
    uVar14 = iVar7 - (uint)((int)uVar14 < 2);
    if (iVar17 == -1) {
      iVar17 = 0;
    }
    lVar12 = (((long)local_6c +
              ((long)(int)local_88 + (long)(iVar7 + -0x7b2) * 0x16d +
               (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar8 * 4) +
              (long)(int)(uVar14 / 400 + ((uVar14 >> 2) - uVar14 / 100) + -0x1dd)) * 0x18) * 0x3c +
             (long)local_70) * 0x3c + (long)iVar17 + (long)local_84 + -0x15180;
    tVar11 = 0;
    if (lVar12 != -1) {
      tVar11 = lVar12;
    }
  }
  return tVar11;
LAB_00466480:
  iVar7 = (int)local_80;
  if (local_84 != -1) goto LAB_0046649d;
  goto LAB_00466493;
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  if(rc == PARSEDATE_OK) {
    if(parsed == -1)
      /* avoid returning -1 for a working scenario */
      parsed++;
    return parsed;
  }
  /* everything else is fail */
  return -1;
}